

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O2

void __thiscall assembler::SessionPDU::skipLines(SessionPDU *this,int skip)

{
  const_iterator cVar1;
  int iVar2;
  size_type __n;
  bool bVar3;
  value_type_conflict local_29;
  
  __n = (size_type)
        ((this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
         _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
         super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl)->pixels_per_scanline;
  cVar1._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)cVar1._M_current -
      (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (ulong)(this->ph_).totalHeaderLength) {
    local_29 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (&this->buf_,cVar1,__n,&local_29);
    this->linesDone_ = this->linesDone_ + 1;
    skip = skip + -1;
  }
  iVar2 = 0;
  if (0 < skip) {
    iVar2 = skip;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    cVar1._M_current =
         (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buf_,cVar1,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(cVar1._M_current + -__n),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )cVar1._M_current);
    this->linesDone_ = this->linesDone_ + 1;
  }
  return;
}

Assistant:

void SessionPDU::skipLines(int skip) {
  auto columns = szParam_->pixels_per_scanline;

  // The header must be complete or this function would not be called,
  // so the number of bytes in excess of the header must be greater
  // than or equal to 0.
  auto bytes = buf_.size() - ph_.totalHeaderLength;
  ASSERT(bytes >= 0);

  // Insert black line if there is no contents yet
  if (bytes == 0) {
    buf_.insert(buf_.end(), columns, 0);
    linesDone_++;
    skip--;
  }

  // Insert copies of the most recent line
  for (auto i = 0; i < skip; i++) {
    buf_.insert(buf_.end(), buf_.end() - columns, buf_.end());
    linesDone_++;
  }
}